

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsTorqueConverter.cpp
# Opt level: O2

void __thiscall
chrono::ChShaftsTorqueConverter::VariablesFbLoadForces(ChShaftsTorqueConverter *this,double factor)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  Scalar *pSVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
  local_30 [24];
  
  dVar1 = this->torque_in;
  ChVariables::Get_fb((ChVectorRef *)local_30,&(this->shaft1->variables).super_ChVariables);
  pSVar5 = Eigen::
           DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
           ::operator()(local_30,0);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = factor;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = dVar1;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *pSVar5;
  auVar6 = vfmadd213sd_fma(auVar11,auVar7,auVar6);
  *pSVar5 = auVar6._0_8_;
  dVar1 = this->torque_out;
  ChVariables::Get_fb((ChVectorRef *)local_30,&(this->shaft2->variables).super_ChVariables);
  pSVar5 = Eigen::
           DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
           ::operator()(local_30,0);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = factor;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = dVar1;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = *pSVar5;
  auVar6 = vfmadd213sd_fma(auVar12,auVar8,auVar2);
  *pSVar5 = auVar6._0_8_;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = this->torque_out;
  auVar4._8_8_ = 0x8000000000000000;
  auVar4._0_8_ = 0x8000000000000000;
  auVar6 = vxorpd_avx512vl(auVar9,auVar4);
  dVar1 = this->torque_in;
  ChVariables::Get_fb((ChVectorRef *)local_30,&(this->shaft_stator->variables).super_ChVariables);
  pSVar5 = Eigen::
           DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
           ::operator()(local_30,0);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = factor;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = auVar6._0_8_ - dVar1;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *pSVar5;
  auVar6 = vfmadd213sd_fma(auVar13,auVar10,auVar3);
  *pSVar5 = auVar6._0_8_;
  return;
}

Assistant:

void ChShaftsTorqueConverter::VariablesFbLoadForces(double factor) {
    // Apply torques to the three connected 1D variables:
    shaft1->Variables().Get_fb()(0) += torque_in * factor;
    shaft2->Variables().Get_fb()(0) += torque_out * factor;
    shaft_stator->Variables().Get_fb()(0) += GetTorqueReactionOnStator() * factor;
}